

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktGeometryLayeredRenderingTests.cpp
# Opt level: O0

string * __thiscall
vkt::geometry::(anonymous_namespace)::getLayerDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,VkImageViewType viewType,
          int layer)

{
  bool bVar1;
  ostream *poVar2;
  ostringstream local_190 [4];
  int numCubeFaces;
  ostringstream str;
  int layer_local;
  VkImageViewType viewType_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  bVar1 = geometry::anon_unknown_0::isCubeImageViewType((VkImageViewType)this);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)local_190,"cube ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)viewType / 6);
    poVar2 = std::operator<<(poVar2,", face ");
    std::ostream::operator<<(poVar2,(int)viewType % 6);
  }
  else if ((VkImageViewType)this == VK_IMAGE_VIEW_TYPE_3D) {
    poVar2 = std::operator<<((ostream *)local_190,"slice z = ");
    std::ostream::operator<<(poVar2,viewType);
  }
  else {
    poVar2 = std::operator<<((ostream *)local_190,"layer ");
    std::ostream::operator<<(poVar2,viewType);
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string getLayerDescription (const VkImageViewType viewType, const int layer)
{
	std::ostringstream str;
	const int numCubeFaces = 6;

	if (isCubeImageViewType(viewType))
		str << "cube " << (layer / numCubeFaces) << ", face " << (layer % numCubeFaces);
	else if (viewType == VK_IMAGE_VIEW_TYPE_3D)
		str << "slice z = " << layer;
	else
		str << "layer " << layer;

	return str.str();
}